

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O1

bool __thiscall duckdb::WriteAheadLogDeserializer::ReplayEntry(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *this_00;
  WALType entry_type;
  int iVar1;
  string str;
  char *local_40 [2];
  char local_30 [16];
  
  this_00 = &this->deserializer;
  BinaryDeserializer::OnObjectBegin(this_00);
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(this_00,100,"wal_type");
  if ((this->deserializer).super_Deserializer.deserialize_enum_from_string == true) {
    (*(this_00->super_Deserializer)._vptr_Deserializer[0x1a])(local_40,this_00);
    entry_type = EnumUtil::FromString<duckdb::WALType>(local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  else {
    iVar1 = (*(this_00->super_Deserializer)._vptr_Deserializer[0xf])(this_00);
    entry_type = (WALType)iVar1;
  }
  (*(this_00->super_Deserializer)._vptr_Deserializer[3])(this_00);
  if (entry_type != WAL_FLUSH) {
    ReplayEntry(this,entry_type);
  }
  BinaryDeserializer::OnObjectEnd(this_00);
  return entry_type == WAL_FLUSH;
}

Assistant:

bool ReplayEntry() {
		deserializer.Begin();
		auto wal_type = deserializer.ReadProperty<WALType>(100, "wal_type");
		if (wal_type == WALType::WAL_FLUSH) {
			deserializer.End();
			return true;
		}
		ReplayEntry(wal_type);
		deserializer.End();
		return false;
	}